

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

void __thiscall
VPLGrammar::Parser::AssignmentExpressionNode::~AssignmentExpressionNode
          (AssignmentExpressionNode *this)

{
  ASTNodeBasic::~ASTNodeBasic(&this->super_ASTNodeBasic);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                if (children_.size() == 1) {
                    children_[0]->BuildProgram(scope, out);
                    return;
                }
                children_[1]->BuildProgram(scope, out);
                scope->LoadVariableAddr(GET_TOKEN_STRING(children_[0]));
                out << "    pop %" << scope->AssignRegister() << '\n';
                scope->Pop();
                out << "    dup\n";
                out << "    pop !" << scope->AssignRegister() << '\n';
            }